

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O2

void __thiscall ConnmanTestMsg::AddTestNode(ConnmanTestMsg *this,CNode *node)

{
  uint *puVar1;
  long lVar2;
  bool bVar3;
  Network NVar4;
  long in_FS_OFFSET;
  CNode *local_30;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock15,&(this->super_CConnman).m_nodes_mutex,"m_nodes_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/net.h"
             ,0x37,false);
  local_30 = node;
  std::vector<CNode*,std::allocator<CNode*>>::emplace_back<CNode*>
            ((vector<CNode*,std::allocator<CNode*>> *)&(this->super_CConnman).m_nodes,&local_30);
  bVar3 = CNode::IsManualOrFullOutboundConn(node);
  if (bVar3) {
    NVar4 = CNetAddr::GetNetwork((CNetAddr *)&node->addr);
    puVar1 = (this->super_CConnman).m_network_conn_counts._M_elems + NVar4;
    *puVar1 = *puVar1 + 1;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock15.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddTestNode(CNode& node)
    {
        LOCK(m_nodes_mutex);
        m_nodes.push_back(&node);

        if (node.IsManualOrFullOutboundConn()) ++m_network_conn_counts[node.addr.GetNetwork()];
    }